

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O1

void Maj_ManFree(Maj_Man_t *p)

{
  Vec_Wrd_t *__ptr;
  Vec_Wec_t *__ptr_00;
  void *__ptr_01;
  long lVar1;
  long lVar2;
  
  bmcg_sat_solver_stop(p->pSat);
  __ptr = p->vInfo;
  if (__ptr->pArray != (word *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (word *)0x0;
  }
  if (__ptr != (Vec_Wrd_t *)0x0) {
    free(__ptr);
  }
  __ptr_00 = p->vOutLits;
  if (0 < __ptr_00->nCap) {
    lVar2 = 8;
    lVar1 = 0;
    do {
      __ptr_01 = *(void **)((long)&__ptr_00->pArray->nCap + lVar2);
      if (__ptr_01 != (void *)0x0) {
        free(__ptr_01);
        *(undefined8 *)((long)&__ptr_00->pArray->nCap + lVar2) = 0;
      }
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar1 < __ptr_00->nCap);
  }
  if (__ptr_00->pArray != (Vec_Int_t *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (Vec_Int_t *)0x0;
  }
  __ptr_00->nCap = 0;
  __ptr_00->nSize = 0;
  free(__ptr_00);
  if (p != (Maj_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Maj_ManFree( Maj_Man_t * p )
{
    bmcg_sat_solver_stop( p->pSat );
    Vec_WrdFree( p->vInfo );
    Vec_WecFree( p->vOutLits );
    ABC_FREE( p );
}